

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

bool CheckSkipGameBlock(FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  
  FScanner::MustGetStringName(sc,"(");
  bVar4 = 0;
  do {
    bVar3 = bVar4;
    FScanner::MustGetString(sc);
    bVar1 = CheckGame(sc->String,false);
    bVar4 = bVar3 | bVar1;
    bVar2 = FScanner::CheckString(sc,",");
  } while (bVar2);
  FScanner::MustGetStringName(sc,")");
  if (bVar3 == 0 && !bVar1) {
    SkipSubBlock(sc);
  }
  return (bool)(~bVar4 & 1);
}

Assistant:

static bool CheckSkipGameBlock(FScanner &sc)
{
	bool filter = false;
	sc.MustGetStringName("(");
	do
	{
		sc.MustGetString();
		filter |= CheckGame(sc.String, false);
	}
	while (sc.CheckString(","));
	sc.MustGetStringName(")");
	if (!filter)
	{
		SkipSubBlock(sc);
		return true;
	}
	return false;
}